

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>>
          (Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
                 *column)

{
  _Rb_tree_header *p_Var1;
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
  *this_00;
  ulong uVar2;
  ID_index IVar3;
  _Rb_tree_color _Var4;
  undefined4 uVar5;
  _Rb_tree_color *p_Var6;
  long lVar7;
  _ValueType __value;
  _Base_ptr p_Var8;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  iterator __begin0;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_38;
  
  p_Var8 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(column->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    this_00 = (vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
               *)(this + 8);
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
      ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                *)this_00,(column->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
      p_Var8 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar11 = *(long *)this_00;
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        uVar10 = 0;
        do {
          uVar5 = *(undefined4 *)&p_Var8[1].field_0x4;
          puVar9 = (undefined4 *)operator_new(8);
          *puVar9 = 0;
          puVar9[1] = uVar5;
          *(undefined4 **)(lVar11 + uVar10 * 8) = puVar9;
          lVar11 = *(long *)this_00;
          **(_Rb_tree_color **)(lVar11 + uVar10 * 8) = p_Var8[1]._M_color;
          uVar10 = (ulong)((int)uVar10 + 1);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      *(int *)(this + 0x20) = (int)((ulong)(*(long *)(this + 0x10) - lVar11) >> 3);
      return true;
    }
    do {
      *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
      IVar3 = *(ID_index *)&p_Var8[1].field_0x4;
      local_38 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(8);
      (local_38->super_Entry_field_element_option).element_ = 0;
      local_38->rowIndex_ = IVar3;
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
      ::
      emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                (this_00,&local_38);
      lVar11 = *(long *)(this + 0x10);
      p_Var6 = *(_Rb_tree_color **)(lVar11 + -8);
      *p_Var6 = p_Var8[1]._M_color;
      lVar7 = *(long *)(this + 8);
      lVar11 = lVar11 - lVar7 >> 3;
      uVar10 = lVar11 - 1;
      if (1 < lVar11) {
        _Var4 = p_Var6[1];
        do {
          uVar2 = uVar10 - 1;
          uVar12 = uVar2 >> 1;
          lVar11 = *(long *)(lVar7 + uVar12 * 8);
          if (_Var4 <= *(_Rb_tree_color *)(lVar11 + 4)) goto LAB_0016b946;
          *(long *)(lVar7 + uVar10 * 8) = lVar11;
          uVar10 = uVar12;
        } while (1 < uVar2);
        uVar10 = 0;
      }
LAB_0016b946:
      *(_Rb_tree_color **)(lVar7 + uVar10 * 8) = p_Var6;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 3) <
        (ulong)(uint)(*(int *)(this + 0x20) * 2)) {
      Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
  }
  return false;
}

Assistant:

inline bool Heap_column<Master_matrix>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      if constexpr (!Master_matrix::Option_list::is_z2) {
        column_[i]->set_element(entry.get_element());
      }
      ++i;
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(1);

  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type)
    pivotVal = get_pivot_value();

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::Option_list::is_z2) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        if (entry.get_row_index() == Chain_opt::get_pivot()) pivotVal = !pivotVal;
      }
      column_.push_back(entryPool_->construct(entry.get_row_index()));
    } else {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
      }
      column_.push_back(entryPool_->construct(entry.get_row_index()));
      column_.back()->set_element(entry.get_element());
    }
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}